

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::nonInitConstCheck
          (TParseContext *this,TSourceLoc *loc,TString *identifier,TType *type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar2;
  TType *type_local;
  TString *identifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar1 = (*type->_vptr_TType[10])();
  if ((((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar1) + 8) & 0x7f) != 2) &&
     (iVar1 = (*type->_vptr_TType[10])(),
     ((uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar1) + 8) & 0x7f) != 0x13)) {
    return;
  }
  iVar1 = (*type->_vptr_TType[10])();
  TQualifier::makeTemporary((TQualifier *)CONCAT44(extraout_var_01,iVar1));
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
           ::c_str(identifier);
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,"variables with qualifier \'const\' must be initialized",pcVar2,"");
  return;
}

Assistant:

void TParseContext::nonInitConstCheck(const TSourceLoc& loc, TString& identifier, TType& type)
{
    //
    // Make the qualifier make sense, given that there is not an initializer.
    //
    if (type.getQualifier().storage == EvqConst ||
        type.getQualifier().storage == EvqConstReadOnly) {
        type.getQualifier().makeTemporary();
        error(loc, "variables with qualifier 'const' must be initialized", identifier.c_str(), "");
    }
}